

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# apted_tree_index_impl.h
# Opt level: O3

int __thiscall
ted::APTEDTreeIndex<cost_model::UnitCostModelLD<label::StringLabel>,_node::TreeIndexAll>::
computeRevKeyRoots(APTEDTreeIndex<cost_model::UnitCostModelLD<label::StringLabel>,_node::TreeIndexAll>
                   *this,TreeIndexAll *t2,int subtreeRootNode,int pathID,
                  vector<int,_std::allocator<int>_> *revKeyRoots,int index)

{
  int iVar1;
  int subtreeRootNode_00;
  pointer pvVar2;
  int *piVar3;
  int index_00;
  int *piVar4;
  
  (revKeyRoots->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
  _M_start[index] = subtreeRootNode;
  index_00 = index + 1;
  if (subtreeRootNode < pathID) {
    do {
      pvVar2 = (t2->super_PreLToChildren).prel_to_children_.
               super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      iVar1 = (t2->super_PreLToParent).prel_to_parent_.super__Vector_base<int,_std::allocator<int>_>
              ._M_impl.super__Vector_impl_data._M_start[pathID];
      piVar3 = *(pointer *)
                ((long)&pvVar2[iVar1].super__Vector_base<int,_std::allocator<int>_>._M_impl + 8);
      for (piVar4 = *(int **)&pvVar2[iVar1].super__Vector_base<int,_std::allocator<int>_>._M_impl;
          piVar4 != piVar3; piVar4 = piVar4 + 1) {
        subtreeRootNode_00 = *piVar4;
        if (subtreeRootNode_00 != pathID) {
          index_00 = computeRevKeyRoots(this,t2,subtreeRootNode_00,
                                        (t2->super_PreLToRLD).prel_to_rld_.
                                        super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                        super__Vector_impl_data._M_start[subtreeRootNode_00],
                                        revKeyRoots,index_00);
        }
      }
      pathID = iVar1;
    } while (subtreeRootNode < iVar1);
  }
  return index_00;
}

Assistant:

int APTEDTreeIndex<CostModel, TreeIndex>::computeRevKeyRoots(
    const TreeIndex& t2, int subtreeRootNode, int pathID,
    std::vector<int>& revKeyRoots, int index) {
  // The subtreeRootNode is a keyroot node. Add it to keyRoots.
  revKeyRoots[index] = subtreeRootNode;
  // Increment the index to know where to store the next keyroot node.
  ++index;
  // Walk up the right path starting with the rightmost leaf of
  // subtreeRootNode, until the child of subtreeRootNode.
  int pathNode = pathID;
  while (pathNode > subtreeRootNode) {
    int parent = t2.prel_to_parent_[pathNode];
    // For each sibling to the left of pathNode, execute this method recursively.
    // Each left sibling of pathNode is a keyroot node.
    for (int child : t2.prel_to_children_[parent]) {
      // Execute computeRevKeyRoots recursively for the new subtree rooted at child and child's rightmost leaf node.
      if (child != pathNode) {
        index = computeRevKeyRoots(t2, child, t2.prel_to_rld_[child], revKeyRoots, index);
      }
    }
    // Walk up.
    pathNode = parent;
  }
  return index;
}